

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O0

void __thiscall UTF8Test_decode_codepoint_Test::TestBody(UTF8Test_decode_codepoint_Test *this)

{
  bool bVar1;
  char *pcVar2;
  decode_result dVar3;
  AssertHelper local_6e0 [8];
  Message local_6d8 [12];
  uint local_6cc;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_6c8;
  char32_t local_6b8;
  size_t local_6b0;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar_23;
  Message local_690 [12];
  char32_t local_684;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_680;
  char32_t local_670 [2];
  size_t local_668;
  undefined1 local_660 [8];
  AssertionResult gtest_ar_22;
  Message local_648 [12];
  uint local_63c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_638;
  char32_t local_628;
  size_t local_620;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_21;
  Message local_600 [12];
  char32_t local_5f4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_5f0;
  char32_t local_5e0 [2];
  size_t local_5d8;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_20;
  Message local_5b8 [12];
  uint local_5ac;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_5a8;
  char32_t local_598;
  size_t local_590;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_19;
  Message local_570 [12];
  char32_t local_564;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_560;
  char32_t local_550 [2];
  size_t local_548;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_18;
  Message local_528 [12];
  uint local_51c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_518;
  char32_t local_508;
  size_t local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_17;
  Message local_4e0 [12];
  char32_t local_4d4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_4d0;
  char32_t local_4c0 [2];
  size_t local_4b8;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_16;
  Message local_498 [12];
  uint local_48c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_488;
  char32_t local_478;
  size_t local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_15;
  Message local_450 [12];
  char32_t local_444;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_440;
  char32_t local_430 [2];
  size_t local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_14;
  Message local_408 [12];
  uint local_3fc;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_3f8;
  char32_t local_3e8;
  size_t local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_13;
  Message local_3c0 [12];
  char32_t local_3b4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_3b0;
  char32_t local_3a0 [2];
  size_t local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_12;
  Message local_378 [12];
  uint local_36c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_368;
  char32_t local_358;
  size_t local_350;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_11;
  Message local_330 [12];
  char32_t local_324;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_320;
  char32_t local_310 [2];
  size_t local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_10;
  Message local_2e8 [12];
  uint local_2dc;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_2d8;
  char32_t local_2c8;
  size_t local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_9;
  Message local_2a0 [12];
  char32_t local_294;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_290;
  char32_t local_280 [2];
  size_t local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_8;
  Message local_258 [12];
  uint local_24c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_248;
  char32_t local_238;
  size_t local_230;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_7;
  Message local_210 [12];
  char32_t local_204;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_200;
  char32_t local_1f0 [2];
  size_t local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_6;
  Message local_1c8 [12];
  uint local_1bc;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_1b8;
  char32_t local_1a8;
  size_t local_1a0;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_5;
  Message local_180 [12];
  char32_t local_174;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_170;
  char32_t local_160 [2];
  size_t local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_4;
  Message local_138 [12];
  uint local_12c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_128;
  char32_t local_118;
  size_t local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0 [12];
  char32_t local_e4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_e0;
  char32_t local_d0 [2];
  size_t local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8 [12];
  uint local_9c;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_98;
  char32_t local_88;
  size_t local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [28];
  char32_t local_44;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_40;
  char32_t local_30 [2];
  size_t local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  UTF8Test_decode_codepoint_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_40 = sv("",0);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_40);
  local_28 = dVar3.units;
  local_30[0] = dVar3.codepoint;
  local_44 = L'\0';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_20,"decode_codepoint( u8\"\"sv ).codepoint","U\'\\0\'",local_30,
             &local_44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_98 = sv("",0);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_98);
  local_80 = dVar3.units;
  local_88 = dVar3.codepoint;
  local_9c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_78,"decode_codepoint( u8\"\"sv ).units","0U",&local_80,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_e0 = sv("",1);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_e0);
  local_c8 = dVar3.units;
  local_d0[0] = dVar3.codepoint;
  local_e4 = L'\0';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_c0,"decode_codepoint( u8\"\\0\"sv ).codepoint","U\'\\0\'",local_d0,
             &local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_128 = sv("",1);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_128);
  local_110 = dVar3.units;
  local_118 = dVar3.codepoint;
  local_12c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_108,"decode_codepoint( u8\"\\0\"sv ).units","1U",&local_110,
             &local_12c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_170 = sv("A",1);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_170);
  local_158 = dVar3.units;
  local_160[0] = dVar3.codepoint;
  local_174 = L'A';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_150,"decode_codepoint( u8\"A\"sv ).codepoint","U\'A\'",local_160,
             &local_174);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_1b8 = sv("A",1);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_1b8);
  local_1a0 = dVar3.units;
  local_1a8 = dVar3.codepoint;
  local_1bc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_198,"decode_codepoint( u8\"A\"sv ).units","1U",&local_1a0,&local_1bc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x57,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_200 = sv("z",1);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_200);
  local_1e8 = dVar3.units;
  local_1f0[0] = dVar3.codepoint;
  local_204 = L'z';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_1e0,"decode_codepoint( u8\"z\"sv ).codepoint","U\'z\'",local_1f0,
             &local_204);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  local_248 = sv("z",1);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_248);
  local_230 = dVar3.units;
  local_238 = dVar3.codepoint;
  local_24c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_228,"decode_codepoint( u8\"z\"sv ).units","1U",&local_230,&local_24c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_290 = sv("\x7f",1);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_290);
  local_278 = dVar3.units;
  local_280[0] = dVar3.codepoint;
  local_294 = L'\x7f';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_270,"decode_codepoint( u8\"\\u007F\"sv ).codepoint","U\'\\u007F\'",
             local_280,&local_294);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(local_2a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2d8 = sv("\x7f",1);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_2d8);
  local_2c0 = dVar3.units;
  local_2c8 = dVar3.codepoint;
  local_2dc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_2b8,"decode_codepoint( u8\"\\u007F\"sv ).units","1U",&local_2c0,
             &local_2dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  local_320 = sv(anon_var_dwarf_1d8533,2);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_320);
  local_308 = dVar3.units;
  local_310[0] = dVar3.codepoint;
  local_324 = L'\x80';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_300,"decode_codepoint( u8\"\\u0080\"sv ).codepoint","U\'\\u0080\'",
             local_310,&local_324);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(local_330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_368 = sv(anon_var_dwarf_1d8533,2);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_368);
  local_350 = dVar3.units;
  local_358 = dVar3.codepoint;
  local_36c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_348,"decode_codepoint( u8\"\\u0080\"sv ).units","2U",&local_350,
             &local_36c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  local_3b0 = sv(anon_var_dwarf_1d855d,2);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_3b0);
  local_398 = dVar3.units;
  local_3a0[0] = dVar3.codepoint;
  local_3b4 = L'߿';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_390,"decode_codepoint( u8\"\\u07FF\"sv ).codepoint","U\'\\u07FF\'",
             local_3a0,&local_3b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  local_3f8 = sv(anon_var_dwarf_1d855d,2);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_3f8);
  local_3e0 = dVar3.units;
  local_3e8 = dVar3.codepoint;
  local_3fc = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_3d8,"decode_codepoint( u8\"\\u07FF\"sv ).units","2U",&local_3e0,
             &local_3fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(local_408);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  local_440 = sv(anon_var_dwarf_1d857b,3);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_440);
  local_428 = dVar3.units;
  local_430[0] = dVar3.codepoint;
  local_444 = L'ࠀ';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_420,"decode_codepoint( u8\"\\u0800\"sv ).codepoint","U\'\\u0800\'",
             local_430,&local_444);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(local_450);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  local_488 = sv(anon_var_dwarf_1d857b,3);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_488);
  local_470 = dVar3.units;
  local_478 = dVar3.codepoint;
  local_48c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_468,"decode_codepoint( u8\"\\u0800\"sv ).units","3U",&local_470,
             &local_48c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    testing::Message::Message(local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  local_4d0 = sv(anon_var_dwarf_1d85a5,3);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_4d0);
  local_4b8 = dVar3.units;
  local_4c0[0] = dVar3.codepoint;
  local_4d4 = L'\xffff';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_4b0,"decode_codepoint( u8\"\\uFFFF\"sv ).codepoint","U\'\\uFFFF\'",
             local_4c0,&local_4d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(local_4e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  local_518 = sv(anon_var_dwarf_1d85a5,3);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_518);
  local_500 = dVar3.units;
  local_508 = dVar3.codepoint;
  local_51c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_4f8,"decode_codepoint( u8\"\\uFFFF\"sv ).units","3U",&local_500,
             &local_51c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  local_560 = sv(anon_var_dwarf_1d85cf,4);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_560);
  local_548 = dVar3.units;
  local_550[0] = dVar3.codepoint;
  local_564 = L'𐀀';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_540,"decode_codepoint( u8\"\\U00010000\"sv ).codepoint",
             "U\'\\U00010000\'",local_550,&local_564);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(local_570);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  local_5a8 = sv(anon_var_dwarf_1d85cf,4);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_5a8);
  local_590 = dVar3.units;
  local_598 = dVar3.codepoint;
  local_5ac = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_588,"decode_codepoint( u8\"\\U00010000\"sv ).units","4U",&local_590,
             &local_5ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  local_5f0 = sv(anon_var_dwarf_1d85f9,4);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_5f0);
  local_5d8 = dVar3.units;
  local_5e0[0] = dVar3.codepoint;
  local_5f4 = L'\x0010ffff';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_5d0,"decode_codepoint( u8\"\\U0010FFFF\"sv ).codepoint",
             "U\'\\U0010FFFF\'",local_5e0,&local_5f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(local_600);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_638 = sv(anon_var_dwarf_1d85f9,4);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_638);
  local_620 = dVar3.units;
  local_628 = dVar3.codepoint;
  local_63c = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_618,"decode_codepoint( u8\"\\U0010FFFF\"sv ).units","4U",&local_620,
             &local_63c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar1) {
    testing::Message::Message(local_648);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_648);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_648);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  local_680 = sv(anon_var_dwarf_1d8617,4);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_680);
  local_668 = dVar3.units;
  local_670[0] = dVar3.codepoint;
  local_684 = L'😄';
  testing::internal::EqHelper::Compare<char32_t,_char32_t,_nullptr>
            ((EqHelper *)local_660,"decode_codepoint( u8\"\\U0001F604\"sv ).codepoint",
             "U\'\\U0001F604\'",local_670,&local_684);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar1) {
    testing::Message::Message(local_690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_690);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  local_6c8 = sv(anon_var_dwarf_1d8617,4);
  dVar3 = jessilib::decode_codepoint<char8_t>(local_6c8);
  local_6b0 = dVar3.units;
  local_6b8 = dVar3.codepoint;
  local_6cc = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_6a8,"decode_codepoint( u8\"\\U0001F604\"sv ).units","4U",&local_6b0,
             &local_6cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(local_6d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6a8);
    testing::internal::AssertHelper::AssertHelper
              (local_6e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(local_6e0,local_6d8);
    testing::internal::AssertHelper::~AssertHelper(local_6e0);
    testing::Message::~Message(local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  return;
}

Assistant:

TEST(UTF8Test, decode_codepoint) {
	DECODE_CODEPOINT_TEST(u8""sv, U'\0', 0U);
	DECODE_CODEPOINT_TEST(u8"\0"sv, U'\0', 1U);
	DECODE_CODEPOINT_TEST(u8"A"sv, U'A', 1U);
	DECODE_CODEPOINT_TEST(u8"z"sv, U'z', 1U);
	DECODE_CODEPOINT_TEST(u8"\u007F"sv, U'\u007F', 1U);
	DECODE_CODEPOINT_TEST(u8"\u0080"sv, U'\u0080', 2U);
	DECODE_CODEPOINT_TEST(u8"\u07FF"sv, U'\u07FF', 2U);
	DECODE_CODEPOINT_TEST(u8"\u0800"sv, U'\u0800', 3U);
	DECODE_CODEPOINT_TEST(u8"\uFFFF"sv, U'\uFFFF', 3U);
	DECODE_CODEPOINT_TEST(u8"\U00010000"sv, U'\U00010000', 4U);
	DECODE_CODEPOINT_TEST(u8"\U0010FFFF"sv, U'\U0010FFFF', 4U);
	DECODE_CODEPOINT_TEST(u8"\U0001F604"sv, U'\U0001F604', 4U);
}